

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_finishOp(lua_State *L)

{
  byte bVar1;
  CallInfo *pCVar2;
  long lVar3;
  lua_KFunction p_Var4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  
  pCVar2 = L->ci;
  lVar3 = (pCVar2->func).offset;
  p_Var4 = (pCVar2->u).c.k;
  lVar6 = lVar3 + 0x10;
  uVar7 = *(uint *)(p_Var4 + -4);
  uVar9 = uVar7 & 0x7f;
  switch(uVar9) {
  case 0x2e:
  case 0x2f:
  case 0x30:
    uVar7 = *(uint *)(p_Var4 + -8);
    break;
  case 0x31:
  case 0x32:
  case 0x34:
    break;
  case 0x33:
  case 0x37:
  case 0x38:
  case 0x3c:
  case 0x3d:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
    return;
  case 0x35:
    lVar3 = (L->top).offset;
    *(undefined8 *)(lVar3 + -0x30) = *(undefined8 *)(lVar3 + -0x10);
    *(undefined1 *)(lVar3 + -0x28) = *(undefined1 *)(lVar3 + -8);
    (L->top).p = (StkId)(lVar3 + -0x20);
    luaV_concat(L,(int)((lVar3 - (lVar6 + (ulong)(uVar7 >> 7 & 0xff) * 0x10)) - 0x20 >> 4));
    return;
  case 0x36:
    (pCVar2->u).l.savedpc = (Instruction *)(p_Var4 + -4);
    return;
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3e:
  case 0x3f:
  case 0x40:
  case 0x41:
    bVar1 = *(byte *)((L->top).offset + -8);
    (L->top).p = (StkId)((L->top).offset + -0x10);
    if (-1 < (short)uVar7 != ((bVar1 & 0xf) != 0 && bVar1 != 1)) {
      return;
    }
    (pCVar2->u).l.savedpc = (Instruction *)((pCVar2->u).c.k + 4);
    return;
  case 0x46:
    (L->top).p = (StkId)(lVar6 + (long)(pCVar2->u2).funcidx * 0x10 + (ulong)(uVar7 >> 3 & 0xff0));
    (pCVar2->u).l.savedpc = (Instruction *)((pCVar2->u).c.k + -4);
    return;
  default:
    if ((3 < uVar9 - 0xb) && (uVar9 != 0x14)) {
      return;
    }
  }
  uVar8 = (ulong)(uVar7 >> 3 & 0xff0);
  lVar5 = (L->top).offset;
  (L->top).p = (StkId)(lVar5 + -0x10);
  *(undefined8 *)(lVar6 + uVar8) = *(undefined8 *)(lVar5 + -0x10);
  *(undefined1 *)(lVar3 + 0x18 + uVar8) = *(undefined1 *)(lVar5 + -8);
  return;
}

Assistant:

void luaV_finishOp (lua_State *L) {
  CallInfo *ci = L->ci;
  StkId base = ci->func.p + 1;
  Instruction inst = *(ci->u.l.savedpc - 1);  /* interrupted instruction */
  OpCode op = GET_OPCODE(inst);
  switch (op) {  /* finish its execution */
    case OP_MMBIN: case OP_MMBINI: case OP_MMBINK: {
      setobjs2s(L, base + GETARG_A(*(ci->u.l.savedpc - 2)), --L->top.p);
      break;
    }
    case OP_UNM: case OP_BNOT: case OP_LEN:
    case OP_GETTABUP: case OP_GETTABLE: case OP_GETI:
    case OP_GETFIELD: case OP_SELF: {
      setobjs2s(L, base + GETARG_A(inst), --L->top.p);
      break;
    }
    case OP_LT: case OP_LE:
    case OP_LTI: case OP_LEI:
    case OP_GTI: case OP_GEI:
    case OP_EQ: {  /* note that 'OP_EQI'/'OP_EQK' cannot yield */
      int res = !l_isfalse(s2v(L->top.p - 1));
      L->top.p--;
#if defined(LUA_COMPAT_LT_LE)
      if (ci->callstatus & CIST_LEQ) {  /* "<=" using "<" instead? */
        ci->callstatus ^= CIST_LEQ;  /* clear mark */
        res = !res;  /* negate result */
      }
#endif
      lua_assert(GET_OPCODE(*ci->u.l.savedpc) == OP_JMP);
      if (res != GETARG_k(inst))  /* condition failed? */
        ci->u.l.savedpc++;  /* skip jump instruction */
      break;
    }
    case OP_CONCAT: {
      StkId top = L->top.p - 1;  /* top when 'luaT_tryconcatTM' was called */
      int a = GETARG_A(inst);      /* first element to concatenate */
      int total = cast_int(top - 1 - (base + a));  /* yet to concatenate */
      setobjs2s(L, top - 2, top);  /* put TM result in proper position */
      L->top.p = top - 1;  /* top is one after last element (at top-2) */
      luaV_concat(L, total);  /* concat them (may yield again) */
      break;
    }
    case OP_CLOSE: {  /* yielded closing variables */
      ci->u.l.savedpc--;  /* repeat instruction to close other vars. */
      break;
    }
    case OP_RETURN: {  /* yielded closing variables */
      StkId ra = base + GETARG_A(inst);
      /* adjust top to signal correct number of returns, in case the
         return is "up to top" ('isIT') */
      L->top.p = ra + ci->u2.nres;
      /* repeat instruction to close other vars. and complete the return */
      ci->u.l.savedpc--;
      break;
    }
    default: {
      /* only these other opcodes can yield */
      lua_assert(op == OP_TFORCALL || op == OP_CALL ||
           op == OP_TAILCALL || op == OP_SETTABUP || op == OP_SETTABLE ||
           op == OP_SETI || op == OP_SETFIELD);
      break;
    }
  }
}